

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

void Am_Abort_Animator(Am_Object *interp)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object_Method method;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar2 = Am_Object::Get(interp,0xf7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    Am_Object::Set(interp,0xf7,false,0);
    pAVar2 = Am_Object::Get(interp,0xc9,0);
    Am_Object_Method::Am_Object_Method(&local_28,pAVar2);
    if (local_28.Call != (Am_Object_Method_Type *)0x0) {
      Am_Object::Am_Object(&local_30,interp);
      (*local_28.Call)((Am_Object_Data *)&local_30);
      Am_Object::~Am_Object(&local_30);
    }
  }
  return;
}

Assistant:

void
Am_Abort_Animator(Am_Object interp)
{
  if (static_cast<bool>(interp.Get(Am_RUNNING)) == false) {
    return;
  }

  interp.Set(Am_RUNNING, false);

  Am_Object_Method method = interp.Get(Am_ABORT_DO_METHOD);
  if (method.Valid()) {
    method.Call(interp);
  }

  return;
}